

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void set_planes_to_neutral_grey(SequenceHeader *seq_params,YV12_BUFFER_CONFIG *buf,int only_chroma)

{
  undefined4 uVar1;
  uint uVar2;
  void *dest;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int row_idx_1;
  int is_uv_1;
  int plane_1;
  int row_idx;
  uint16_t *base;
  int is_uv;
  int plane;
  int val;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_1c;
  
  local_30 = in_EDX;
  if (*(char *)(in_RDI + 0x4c) == '\0') {
    for (; local_30 < 3; local_30 = local_30 + 1) {
      uVar2 = (uint)(0 < local_30);
      for (local_38 = 0; local_38 < *(int *)(in_RSI + 0x18 + (long)(int)uVar2 * 4);
          local_38 = local_38 + 1) {
        memset((void *)(*(long *)(in_RSI + 0x28 + (long)local_30 * 8) +
                       (long)(local_38 * *(int *)(in_RSI + 0x20 + (long)(int)uVar2 * 4))),0x80,
               (long)*(int *)(in_RSI + 0x10 + (long)(int)uVar2 * 4));
      }
    }
  }
  else {
    uVar1 = *(undefined4 *)(in_RDI + 0x48);
    for (local_1c = in_EDX; local_1c < 3; local_1c = local_1c + 1) {
      uVar2 = (uint)(0 < local_1c);
      dest = (void *)(*(long *)(in_RSI + 0x28 + (long)local_1c * 8) * 2);
      if (0 < *(int *)(in_RSI + 0x18 + (long)(int)uVar2 * 4)) {
        aom_memset16(dest,1 << ((char)uVar1 - 1U & 0x1f),
                     (long)*(int *)(in_RSI + 0x10 + (long)(int)uVar2 * 4));
        for (local_2c = 1; local_2c < *(int *)(in_RSI + 0x18 + (long)(int)uVar2 * 4);
            local_2c = local_2c + 1) {
          memcpy((void *)((long)dest +
                         (long)(local_2c * *(int *)(in_RSI + 0x20 + (long)(int)uVar2 * 4)) * 2),dest
                 ,(long)*(int *)(in_RSI + 0x10 + (long)(int)uVar2 * 4) << 1);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void set_planes_to_neutral_grey(
    const SequenceHeader *const seq_params, const YV12_BUFFER_CONFIG *const buf,
    int only_chroma) {
  if (seq_params->use_highbitdepth) {
    const int val = 1 << (seq_params->bit_depth - 1);
    for (int plane = only_chroma; plane < MAX_MB_PLANE; plane++) {
      const int is_uv = plane > 0;
      uint16_t *const base = CONVERT_TO_SHORTPTR(buf->buffers[plane]);
      // Set the first row to neutral grey. Then copy the first row to all
      // subsequent rows.
      if (buf->crop_heights[is_uv] > 0) {
        aom_memset16(base, val, buf->crop_widths[is_uv]);
        for (int row_idx = 1; row_idx < buf->crop_heights[is_uv]; row_idx++) {
          memcpy(&base[row_idx * buf->strides[is_uv]], base,
                 sizeof(*base) * buf->crop_widths[is_uv]);
        }
      }
    }
  } else {
    for (int plane = only_chroma; plane < MAX_MB_PLANE; plane++) {
      const int is_uv = plane > 0;
      for (int row_idx = 0; row_idx < buf->crop_heights[is_uv]; row_idx++) {
        memset(&buf->buffers[plane][row_idx * buf->strides[is_uv]], 1 << 7,
               buf->crop_widths[is_uv]);
      }
    }
  }
}